

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O2

bool __thiscall iutest::TestSuite::Passed(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = failed_test_count(this);
  if (iVar2 != 0) {
    return false;
  }
  bVar1 = TestResult::Passed(&this->m_ad_hoc_testresult);
  return bVar1;
}

Assistant:

bool            Passed()                const { return failed_test_count() == 0 && m_ad_hoc_testresult.Passed(); }